

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

void __thiscall
cmCTestMultiProcessHandler::SetTests
          (cmCTestMultiProcessHandler *this,TestMap *tests,PropertiesMap *properties)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  mapped_type_conflict1 *pmVar3;
  _Base_ptr p_Var4;
  
  std::
  _Rb_tree<int,_std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>,_std::_Select1st<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
  ::operator=((_Rb_tree<int,_std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>,_std::_Select1st<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
               *)&this->Tests,
              (_Rb_tree<int,_std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>,_std::_Select1st<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
               *)tests);
  std::
  _Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
  ::operator=((_Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
               *)&this->Properties,
              (_Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
               *)properties);
  p_Var4 = (this->Tests).
           super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  this->Total = (this->Tests).
                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_node_count;
  p_Var1 = &(this->Tests).
            super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      pmVar3 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
               operator[](&this->TestRunningMap,(key_type *)(p_Var4 + 1));
      *pmVar3 = false;
      pmVar3 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
               operator[](&this->TestFinishMap,(key_type *)(p_Var4 + 1));
      *pmVar3 = false;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  bVar2 = cmCTest::GetShowOnly(this->CTest);
  if (!bVar2) {
    ReadCostData(this);
    bVar2 = CheckCycles(this);
    this->HasCycles = !bVar2;
    if (bVar2) {
      CreateTestCostList(this);
      return;
    }
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::SetTests(TestMap& tests,
                                          PropertiesMap& properties)
{
  this->Tests = tests;
  this->Properties = properties;
  this->Total = this->Tests.size();
  // set test run map to false for all
  for (TestMap::iterator i = this->Tests.begin(); i != this->Tests.end();
       ++i) {
    this->TestRunningMap[i->first] = false;
    this->TestFinishMap[i->first] = false;
  }
  if (!this->CTest->GetShowOnly()) {
    this->ReadCostData();
    this->HasCycles = !this->CheckCycles();
    if (this->HasCycles) {
      return;
    }
    this->CreateTestCostList();
  }
}